

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

string * __thiscall
llvm::Triple::merge_abi_cxx11_(string *__return_storage_ptr__,Triple *this,Triple *Other)

{
  pointer pcVar1;
  bool bVar2;
  
  if (this->Vendor == Apple) {
    bVar2 = isOSVersionLT(Other,this);
    if (bVar2) goto LAB_0019093b;
  }
  this = Other;
LAB_0019093b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->Data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Data)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Triple::merge(const Triple &Other) const {
  // If vendor is apple, pick the triple with the larger version number.
  if (getVendor() == Triple::Apple)
    if (Other.isOSVersionLT(*this))
      return str();

  return Other.str();
}